

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

bool __thiscall
Lowerer::GenerateAdjustBaseSlots
          (Lowerer *this,Instr *instrInsert,RegOpnd *baseOpnd,JITTypeHolder initialType,
          JITTypeHolder finalType)

{
  code *pcVar1;
  RegOpnd *pRVar2;
  bool bVar3;
  JITType *pJVar4;
  JITTypeHandler *pJVar5;
  JITTypeHandler *pJVar6;
  undefined4 *puVar7;
  IntConstOpnd *pIVar8;
  HelperCallOpnd *newSrc;
  Instr *this_00;
  Instr *instr;
  Opnd *opnd;
  int newAuxSlotCapacity;
  int iStack_40;
  bool needSlotAdjustment;
  PropertyIndex newInlineSlotCapacity;
  PropertyIndex inlineSlotCapacity;
  int newCount;
  int oldCount;
  RegOpnd *baseOpnd_local;
  Instr *instrInsert_local;
  Lowerer *this_local;
  JITTypeHolder finalType_local;
  JITTypeHolder initialType_local;
  
  _newCount = baseOpnd;
  baseOpnd_local = (RegOpnd *)instrInsert;
  instrInsert_local = (Instr *)this;
  this_local = (Lowerer *)finalType.t;
  finalType_local = initialType;
  pJVar4 = JITTypeHolderBase<void>::operator->(&finalType_local);
  pJVar5 = JITType::GetTypeHandler(pJVar4);
  pJVar4 = JITTypeHolderBase<void>::operator->((JITTypeHolderBase<void> *)&this_local);
  pJVar6 = JITType::GetTypeHandler(pJVar4);
  bVar3 = JITTypeHandler::IsTypeHandlerCompatibleForObjectHeaderInlining(pJVar5,pJVar6);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2049,
                       "(JITTypeHandler::IsTypeHandlerCompatibleForObjectHeaderInlining(initialType->GetTypeHandler(), finalType->GetTypeHandler()))"
                       ,"Incompatible typeHandler transition?");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  _newInlineSlotCapacity = 0;
  iStack_40 = 0;
  newAuxSlotCapacity._2_2_ = 0;
  newAuxSlotCapacity._0_2_ = 0;
  pJVar4 = JITTypeHolderBase<void>::operator->(&finalType_local);
  pJVar5 = JITType::GetTypeHandler(pJVar4);
  pJVar4 = JITTypeHolderBase<void>::operator->((JITTypeHolderBase<void> *)&this_local);
  pJVar6 = JITType::GetTypeHandler(pJVar4);
  bVar3 = JITTypeHandler::NeedSlotAdjustment
                    (pJVar5,pJVar6,(int *)&newInlineSlotCapacity,&stack0xffffffffffffffc0,
                     (PropertyIndex *)((long)&newAuxSlotCapacity + 2),
                     (PropertyIndex *)&newAuxSlotCapacity);
  if (bVar3) {
    if (iStack_40 <= (int)(uint)(ushort)newAuxSlotCapacity) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x205d,"(newCount > newInlineSlotCapacity)",
                         "newCount > newInlineSlotCapacity");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    pRVar2 = baseOpnd_local;
    pIVar8 = IR::IntConstOpnd::New
                       ((long)(int)(iStack_40 - (uint)(ushort)newAuxSlotCapacity),TyInt32,
                        this->m_func,false);
    LowererMD::LoadHelperArgument(&this->m_lowererMD,(Instr *)pRVar2,&pIVar8->super_Opnd);
    pRVar2 = baseOpnd_local;
    pIVar8 = IR::IntConstOpnd::New((ulong)(ushort)newAuxSlotCapacity,TyUint16,this->m_func,false);
    LowererMD::LoadHelperArgument(&this->m_lowererMD,(Instr *)pRVar2,&pIVar8->super_Opnd);
    LowererMD::LoadHelperArgument(&this->m_lowererMD,(Instr *)baseOpnd_local,&_newCount->super_Opnd)
    ;
    newSrc = IR::HelperCallOpnd::New(HelperAdjustSlots,this->m_func);
    this_00 = IR::Instr::New(Call,this->m_func);
    IR::Instr::SetSrc1(this_00,&newSrc->super_Opnd);
    IR::Instr::InsertBefore((Instr *)baseOpnd_local,this_00);
    LowererMD::LowerCall(&this->m_lowererMD,this_00,0);
    initialType_local.t._7_1_ = true;
  }
  else {
    initialType_local.t._7_1_ = false;
  }
  return initialType_local.t._7_1_;
}

Assistant:

bool
Lowerer::GenerateAdjustBaseSlots(IR::Instr *instrInsert, IR::RegOpnd *baseOpnd, JITTypeHolder initialType, JITTypeHolder finalType)
{
    // Possibly allocate new slot capacity to accommodate a type transition.
    AssertMsg(JITTypeHandler::IsTypeHandlerCompatibleForObjectHeaderInlining(initialType->GetTypeHandler(), finalType->GetTypeHandler()),
        "Incompatible typeHandler transition?");

    int oldCount = 0;
    int newCount = 0;
    Js::PropertyIndex inlineSlotCapacity = 0;
    Js::PropertyIndex newInlineSlotCapacity = 0;
    bool needSlotAdjustment =
        JITTypeHandler::NeedSlotAdjustment(initialType->GetTypeHandler(), finalType->GetTypeHandler(), &oldCount, &newCount, &inlineSlotCapacity, &newInlineSlotCapacity);

    if (!needSlotAdjustment)
    {
        return false;
    }

    // Call AdjustSlots using the new counts. Because AdjustSlots uses the "no dispose" flavor of alloc,
    // no implicit calls are possible, and we don't need an implicit call check and bailout.

    // CALL AdjustSlots, instance, newInlineSlotCapacity, newAuxSlotCapacity

    //3rd Param
    Assert(newCount > newInlineSlotCapacity);
    const int newAuxSlotCapacity = newCount - newInlineSlotCapacity;
    m_lowererMD.LoadHelperArgument(instrInsert, IR::IntConstOpnd::New(newAuxSlotCapacity, TyInt32, this->m_func));

    //2nd Param
    m_lowererMD.LoadHelperArgument(instrInsert, IR::IntConstOpnd::New(newInlineSlotCapacity, TyUint16, this->m_func));

    //1st Param (instance)
    m_lowererMD.LoadHelperArgument(instrInsert, baseOpnd);

    //CALL HelperAdjustSlots
    IR::Opnd *opnd = IR::HelperCallOpnd::New(IR::HelperAdjustSlots, this->m_func);
    IR::Instr *instr = IR::Instr::New(Js::OpCode::Call, this->m_func);
    instr->SetSrc1(opnd);
    instrInsert->InsertBefore(instr);
    m_lowererMD.LowerCall(instr, 0);

    return true;
}